

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varint.h
# Opt level: O0

char * Varint::Parse32FallbackInline(char *p,uint32 *OUTPUT)

{
  byte bVar1;
  uint uVar2;
  uint local_30;
  uint32 result;
  uint32 byte;
  uchar *ptr;
  uint32 *OUTPUT_local;
  char *p_local;
  
  if ((byte)*p < 0x80) {
    __assert_fail("byte >= 128",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/coding/varint.h"
                  ,0xb7,"static const char *Varint::Parse32FallbackInline(const char *, uint32 *)");
  }
  _result = (byte *)(p + 2);
  local_30 = ((byte)p[1] & 0x7f) << 7 | (byte)*p & 0x7f;
  if (0x7f < (byte)p[1]) {
    bVar1 = *_result;
    local_30 = (bVar1 & 0x7f) << 0xe | local_30;
    _result = (byte *)(p + 3);
    if (0x7f < bVar1) {
      uVar2 = (uint)(byte)p[3];
      local_30 = (uVar2 & 0x7f) << 0x15 | local_30;
      _result = (byte *)(p + 4);
      if (0x7f < uVar2) {
        uVar2 = (uint)(byte)p[4];
        local_30 = uVar2 << 0x1c | local_30;
        _result = (byte *)(p + 5);
        if (0xf < uVar2) {
          return (char *)0x0;
        }
      }
    }
  }
  *OUTPUT = local_30;
  return (char *)_result;
}

Assistant:

inline const char* Varint::Parse32FallbackInline(const char* p,
                                                 uint32* OUTPUT) {
  // Fast path
  const unsigned char* ptr = reinterpret_cast<const unsigned char*>(p);
  uint32 byte, result;
  byte = *(ptr++); result = byte & 127;
  assert(byte >= 128);   // Already checked in inlined prelude
  byte = *(ptr++); result |= (byte & 127) <<  7; if (byte < 128) goto done;
  byte = *(ptr++); result |= (byte & 127) << 14; if (byte < 128) goto done;
  byte = *(ptr++); result |= (byte & 127) << 21; if (byte < 128) goto done;
  byte = *(ptr++); result |= (byte & 127) << 28; if (byte < 16) goto done;
  return nullptr;       // Value is too long to be a varint32
 done:
  *OUTPUT = result;
  return reinterpret_cast<const char*>(ptr);
}